

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O0

void KeccakP1600_ExtractBytes(void *state,uchar *data,uint offset,uint length)

{
  uint uVar1;
  uint offset_00;
  uint in_ECX;
  uint in_EDX;
  void *in_RSI;
  uint _bytesInLane;
  uchar *_curData;
  uint _offsetInLane;
  uint _lanePosition;
  uint _sizeLeft;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar2;
  void *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (in_EDX == 0) {
    KeccakP1600_ExtractLanes
              (in_stack_ffffffffffffffd0,
               (uchar *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    KeccakP1600_ExtractBytesInLane
              (in_RSI,in_EDX,(uchar *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  else {
    uVar1 = in_EDX >> 3;
    offset_00 = in_EDX & 7;
    for (; in_ECX != 0; in_ECX = in_ECX - uVar2) {
      uVar2 = 8 - offset_00;
      if (in_ECX < 8 - offset_00) {
        uVar2 = in_ECX;
      }
      KeccakP1600_ExtractBytesInLane
                (in_RSI,in_EDX,(uchar *)CONCAT44(in_ECX,uVar1),offset_00,in_stack_ffffffffffffffd8);
      uVar1 = uVar1 + 1;
      offset_00 = 0;
    }
  }
  return;
}

Assistant:

void KeccakP1600_ExtractBytes(const void *state, unsigned char *data, unsigned int offset, unsigned int length)
{
    SnP_ExtractBytes(state, data, offset, length, KeccakP1600_ExtractLanes, KeccakP1600_ExtractBytesInLane, 8);
}